

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
opengv::math::o3_roots(vector<double,_std::allocator<double>_> *p)

{
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  vector<double,_std::allocator<double>_> *this;
  value_type_conflict1 *__x;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  complex<double> r3;
  complex<double> r2;
  complex<double> r1;
  double r;
  double a3;
  double r3_1;
  complex<double> C3_1;
  double C3;
  complex<double> C;
  complex<double> u3;
  complex<double> u2;
  complex<double> u1;
  double term;
  double theta_1;
  double theta_0;
  double *d;
  double *c;
  double *b;
  double *a;
  vector<double,_std::allocator<double>_> *roots;
  complex<double> *in_stack_fffffffffffffce8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcf0;
  complex<double> local_1c8 [6];
  undefined8 local_168;
  complex<double> local_160 [6];
  undefined8 local_100;
  complex<double> local_f8;
  complex<double> local_e8;
  double local_d8;
  double local_d0;
  double local_c8;
  complex<double> local_c0;
  complex<double> local_b0;
  complex<double> local_a0;
  double local_90;
  complex<double> local_88;
  complex<double> local_78;
  complex<double> local_68;
  complex<double> local_58;
  double local_48;
  double local_40;
  double local_38;
  const_reference local_30;
  double *local_28;
  double *local_20;
  double *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_10 = in_RSI;
  local_18 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  local_20 = std::vector<double,_std::allocator<double>_>::operator[](local_10,1);
  local_28 = std::vector<double,_std::allocator<double>_>::operator[](local_10,2);
  local_30 = std::vector<double,_std::allocator<double>_>::operator[](local_10,3);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *local_20;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *local_20;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -(*local_18 * 3.0 * *local_28);
  auVar7 = vfmadd213sd_fma(auVar7,auVar16,auVar21);
  local_38 = auVar7._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *local_20;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *local_20 * 2.0 * *local_20;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = -(*local_18 * 9.0 * *local_20 * *local_28);
  auVar7 = vfmadd213sd_fma(auVar22,auVar8,auVar17);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *local_30;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *local_18 * 27.0 * *local_18;
  auVar7 = vfmadd213sd_fma(auVar9,auVar18,auVar7);
  auVar10._0_8_ = auVar7._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar10._0_8_;
  auVar10._8_8_ = 0;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = -(local_38 * 4.0 * local_38 * local_38);
  auVar7 = vfmadd213sd_fma(auVar10,auVar19,auVar23);
  local_48 = auVar7._0_8_;
  local_40 = auVar10._0_8_;
  std::complex<double>::complex(&local_58,1.0,0.0);
  dVar1 = sqrt(3.0);
  std::complex<double>::complex(&local_68,-0.5,dVar1 * 0.5);
  dVar1 = sqrt(3.0);
  std::complex<double>::complex(&local_78,-0.5,dVar1 * -0.5);
  std::complex<double>::complex(&local_88,0.0,0.0);
  dVar1 = local_40;
  if (local_48 < 0.0) {
    dVar1 = local_40 * 0.5;
    dVar2 = sqrt(-local_48);
    std::complex<double>::complex(&local_c0,dVar1,dVar2 * 0.5);
    dVar1 = std::complex<double>::real_abi_cxx11_(&local_c0);
    dVar1 = pow(dVar1,2.0);
    dVar2 = std::complex<double>::imag_abi_cxx11_(&local_c0);
    dVar2 = pow(dVar2,2.0);
    local_c8 = sqrt(dVar1 + dVar2);
    dVar1 = std::complex<double>::imag_abi_cxx11_(&local_c0);
    dVar2 = std::complex<double>::real_abi_cxx11_(&local_c0);
    local_d0 = atan(dVar1 / dVar2);
    dVar1 = std::complex<double>::real_abi_cxx11_(&local_c0);
    if (dVar1 < 0.0) {
      local_d0 = local_d0 + 3.141592653589793;
    }
    dVar2 = pow(local_c8,0.3333333333333333);
    local_d8 = dVar2;
    dVar3 = cos(local_d0 / 3.0);
    dVar1 = local_d8;
    dVar4 = sin(local_d0 / 3.0);
    std::complex<double>::complex(&local_e8,dVar2 * dVar3,dVar1 * dVar4);
    local_88._M_value._0_8_ = local_e8._M_value._0_8_;
    local_88._M_value._8_8_ = local_e8._M_value._8_8_;
  }
  else {
    dVar2 = sqrt(local_48);
    local_90 = (dVar1 + dVar2) * 0.5;
    if (0.0 <= local_90) {
      dVar1 = pow(local_90,0.3333333333333333);
      std::complex<double>::complex(&local_b0,dVar1,0.0);
      local_88._M_value._0_8_ = local_b0._M_value._0_8_;
      local_88._M_value._8_8_ = local_b0._M_value._8_8_;
    }
    else {
      dVar1 = pow(-local_90,0.3333333333333333);
      std::complex<double>::complex(&local_a0,-dVar1,0.0);
      local_88._M_value._0_8_ = local_a0._M_value._0_8_;
      local_88._M_value._8_8_ = local_a0._M_value._8_8_;
    }
  }
  auVar11._0_8_ = 1.0 / (*local_18 * 3.0);
  auVar11._8_8_ = 0;
  auVar20._8_8_ = 0x8000000000000000;
  auVar20._0_8_ = 0x8000000000000000;
  uVar15 = 0x8000000000000000;
  uVar6 = SUB168(auVar11 ^ auVar20,0);
  local_100 = vmovlpd_avx(auVar11 ^ auVar20);
  std::operator*(in_stack_fffffffffffffce8,(complex<double> *)0xacfeee);
  local_160[3]._M_value._0_8_ = uVar6;
  local_160[3]._M_value._8_8_ = uVar15;
  std::operator+((double *)in_stack_fffffffffffffce8,(complex<double> *)0xacff12);
  local_160[4]._M_value._0_8_ = uVar6;
  local_160[4]._M_value._8_8_ = uVar15;
  std::operator*(in_stack_fffffffffffffce8,(complex<double> *)0xacff33);
  local_160[1]._M_value._0_8_ = uVar6;
  local_160[1]._M_value._8_8_ = uVar15;
  std::operator/((double *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  local_160[2]._M_value._0_8_ = uVar6;
  local_160[2]._M_value._8_8_ = uVar15;
  std::operator+(in_stack_fffffffffffffce8,(complex<double> *)0xacff86);
  local_160[5]._M_value._0_8_ = uVar6;
  local_160[5]._M_value._8_8_ = uVar15;
  std::operator*((double *)in_stack_fffffffffffffce8,(complex<double> *)0xacffad);
  uVar14 = 0x8000000000000000;
  auVar12._0_8_ = 1.0 / (*local_18 * 3.0);
  auVar12._8_8_ = 0;
  uVar5 = SUB168(auVar12 ^ auVar20,0);
  local_168 = vmovlpd_avx(auVar12 ^ auVar20);
  local_f8._M_value._0_8_ = uVar6;
  local_f8._M_value._8_8_ = uVar15;
  std::operator*(in_stack_fffffffffffffce8,(complex<double> *)0xad001e);
  local_1c8[3]._M_value._0_8_ = uVar5;
  local_1c8[3]._M_value._8_8_ = uVar14;
  std::operator+((double *)in_stack_fffffffffffffce8,(complex<double> *)0xad0042);
  local_1c8[4]._M_value._0_8_ = uVar5;
  local_1c8[4]._M_value._8_8_ = uVar14;
  std::operator*(in_stack_fffffffffffffce8,(complex<double> *)0xad0063);
  local_1c8[1]._M_value._0_8_ = uVar5;
  local_1c8[1]._M_value._8_8_ = uVar14;
  std::operator/((double *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  local_1c8[2]._M_value._0_8_ = uVar5;
  local_1c8[2]._M_value._8_8_ = uVar14;
  std::operator+(in_stack_fffffffffffffce8,(complex<double> *)0xad00ae);
  local_1c8[5]._M_value._0_8_ = uVar5;
  local_1c8[5]._M_value._8_8_ = uVar14;
  std::operator*((double *)in_stack_fffffffffffffce8,(complex<double> *)0xad00d5);
  uVar15 = 0x8000000000000000;
  auVar13._0_8_ = 1.0 / (*local_18 * 3.0);
  auVar13._8_8_ = 0;
  uVar6 = SUB168(auVar13 ^ auVar20,0);
  vmovlpd_avx(auVar13 ^ auVar20);
  local_160[0]._M_value._0_8_ = uVar5;
  local_160[0]._M_value._8_8_ = uVar14;
  std::operator*(in_stack_fffffffffffffce8,(complex<double> *)0xad0146);
  std::operator+((double *)in_stack_fffffffffffffce8,(complex<double> *)0xad016a);
  std::operator*(in_stack_fffffffffffffce8,(complex<double> *)0xad018b);
  std::operator/((double *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  std::operator+(in_stack_fffffffffffffce8,(complex<double> *)0xad01d6);
  std::operator*((double *)in_stack_fffffffffffffce8,(complex<double> *)0xad01fd);
  local_1c8[0]._M_value._0_8_ = uVar6;
  local_1c8[0]._M_value._8_8_ = uVar15;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0xad0224);
  std::complex<double>::real_abi_cxx11_(&local_f8);
  std::vector<double,_std::allocator<double>_>::push_back
            (in_stack_fffffffffffffcf0,(value_type_conflict1 *)in_stack_fffffffffffffce8);
  this = (vector<double,_std::allocator<double>_> *)std::complex<double>::real_abi_cxx11_(local_160)
  ;
  std::vector<double,_std::allocator<double>_>::push_back
            (this,(value_type_conflict1 *)in_stack_fffffffffffffce8);
  __x = (value_type_conflict1 *)std::complex<double>::real_abi_cxx11_(local_1c8);
  std::vector<double,_std::allocator<double>_>::push_back(this,__x);
  return in_RDI;
}

Assistant:

std::vector<double>
opengv::math::o3_roots( const std::vector<double> & p )
{
  const double & a = p[0];
  const double & b = p[1];
  const double & c = p[2];
  const double & d = p[3];
  
  double theta_0 = b*b - 3.0*a*c;
  double theta_1 = 2.0*b*b*b - 9.0*a*b*c + 27.0*a*a*d;
  double term = theta_1 * theta_1 - 4.0 * theta_0 * theta_0 * theta_0;
  
  std::complex<double> u1( 1.0, 0.0);
  std::complex<double> u2(-0.5, 0.5*sqrt(3.0));
  std::complex<double> u3(-0.5,-0.5*sqrt(3.0));
  std::complex<double> C;
  
  if( term >= 0.0 )
  {
    double C3 = 0.5 * (theta_1 + sqrt(term));
    
    if( C3 < 0.0 )
      C = std::complex<double>(-pow(-C3,(1.0/3.0)),0.0);
    else
      C = std::complex<double>( pow( C3,(1.0/3.0)),0.0);
  }
  else
  {
    std::complex<double> C3( 0.5*theta_1, 0.5*sqrt(-term) );
    
    //take the third root of this complex number
    double r3 = sqrt(pow(C3.real(),2.0)+pow(C3.imag(),2.0));
    double a3 = atan(C3.imag() / C3.real());
    if( C3.real() < 0 )
      a3 += M_PI;
    
    double r = pow(r3,(1.0/3.0));
    C = std::complex<double>(r*cos(a3/3.0),r*sin(a3/3.0));
  }
  
  std::complex<double> r1 = -(1.0/(3.0*a)) * (b + u1*C + theta_0 / (u1*C) );
  std::complex<double> r2 = -(1.0/(3.0*a)) * (b + u2*C + theta_0 / (u2*C) );
  std::complex<double> r3 = -(1.0/(3.0*a)) * (b + u3*C + theta_0 / (u3*C) );
  
  std::vector<double> roots;
  roots.push_back(r1.real());
  roots.push_back(r2.real());
  roots.push_back(r3.real());
  return roots;
}